

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::Connect
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aAddr,uint16_t aPort)

{
  ConnectHandler local_70;
  undefined1 local_50 [8];
  anon_class_40_2_3adf01b8 onConnected;
  uint16_t aPort_local;
  string *aAddr_local;
  ErrorHandler *aHandler_local;
  CommissionerImpl *this_local;
  
  onConnected.this._6_2_ = aPort;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)local_50,aHandler);
  onConnected.aHandler._M_invoker = (_Invoker_type)this;
  std::function<void(ot::commissioner::DtlsSession&,ot::commissioner::Error)>::
  function<ot::commissioner::CommissionerImpl::Connect(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)::__0&,void>
            ((function<void(ot::commissioner::DtlsSession&,ot::commissioner::Error)> *)&local_70,
             (anon_class_40_2_3adf01b8 *)local_50);
  coap::CoapSecure::Connect(&this->mBrClient,&local_70,aAddr,onConnected.this._6_2_);
  std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::~function
            (&local_70);
  Connect(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_short)::
  $_0::~__0((__0 *)local_50);
  return;
}

Assistant:

void CommissionerImpl::Connect(ErrorHandler aHandler, const std::string &aAddr, uint16_t aPort)
{
    auto onConnected = [&, aHandler](const DtlsSession &, Error aError) {
        if (aError == ErrorCode::kNone)
        {
            this->mState = State::kConnected;
        }
        aHandler(aError);
    };
    mBrClient.Connect(onConnected, aAddr, aPort);
}